

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSimSeq.c
# Opt level: O2

int Raig_ManSimulate(Aig_Man_t *pAig,int nWords,int nIters,int TimeLimit,int fMiter,int fVerbose)

{
  int iNode;
  uint uVar1;
  abctime aVar2;
  Raig_Man_t *p;
  abctime aVar3;
  abctime aVar4;
  Abc_Cex_t *pAVar5;
  uint iFrame;
  int level;
  int iPat;
  int local_3c;
  int local_38;
  uint local_34;
  
  aVar2 = Abc_Clock();
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                  ,0x1cc,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
  }
  Sec_MiterStatus((Sec_MtrStatus_t *)&iPat,pAig);
  if (local_3c < 1) {
    if (local_38 == 0) {
      puts("Miter is trivially unsatisfiable.");
      uVar1 = 0;
    }
    else {
      Aig_ManRandom(1);
      p = Raig_ManCreate(pAig);
      p->nWords = nWords;
      uVar1 = 0;
      if (0 < nIters) {
        uVar1 = nIters;
      }
      iNode = 0;
      iFrame = 0;
      do {
        if (uVar1 == iFrame) goto LAB_00527b5e;
        aVar3 = Abc_Clock();
        iNode = Raig_ManSimulateRound(p,fMiter,(uint)(iFrame == 0),&iPat);
        if (fVerbose != 0) {
          printf("Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iFrame + 1),
                 (ulong)(uint)nIters,(ulong)(uint)TimeLimit);
          aVar4 = Abc_Clock();
          printf("Time = %7.2f sec\r",((double)aVar4 - (double)aVar2) / 1000000.0);
        }
        if (0 < iNode) {
          uVar1 = Raig_ManFindPo(p->pAig,iNode);
          if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
            __assert_fail("pAig->pSeqModel == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigSimSeq.c"
                          ,0x1e8,"int Raig_ManSimulate(Aig_Man_t *, int, int, int, int, int)");
          }
          pAVar5 = Raig_ManGenerateCounter(pAig,iFrame,uVar1,nWords,iPat,p->vCis2Ids);
          pAig->pSeqModel = pAVar5;
          if (fVerbose == 0) goto LAB_00527c62;
          printf("Miter is satisfiable after simulation (output %d).\n",(ulong)uVar1);
          goto LAB_00527bed;
        }
        aVar4 = Abc_Clock();
        iFrame = iFrame + 1;
      } while ((aVar4 - aVar3) / 1000000 < (long)TimeLimit);
      printf("No bug detected after %d frames with time limit %d seconds.\n",(ulong)iFrame,
             (ulong)(uint)TimeLimit);
LAB_00527b5e:
      if (fVerbose != 0) {
LAB_00527bed:
        level = 0x7a91de;
        printf("Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ",
               (double)(p->nObjs << 4) * 9.5367431640625e-07,
               (double)((nWords * 4 + 4) * p->nMemsMax) * 9.5367431640625e-07);
        Abc_Print(level,"%s =","Total time");
        aVar3 = Abc_Clock();
        Abc_Print(level,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
      }
LAB_00527c62:
      Raig_ManDelete(p);
      uVar1 = (uint)(0 < iNode);
    }
  }
  else {
    printf("Miter is trivially satisfiable (output %d).\n",(ulong)local_34);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int Raig_ManSimulate( Aig_Man_t * pAig, int nWords, int nIters, int TimeLimit, int fMiter, int fVerbose )
{
    Raig_Man_t * p;
    Sec_MtrStatus_t Status;
    int i, iPat, RetValue = 0;
    abctime clk, clkTotal = Abc_Clock();
    assert( Aig_ManRegNum(pAig) > 0 );
    Status = Sec_MiterStatus( pAig );
    if ( Status.nSat > 0 )
    {
        printf( "Miter is trivially satisfiable (output %d).\n", Status.iOut );
        return 1;
    }
    if ( Status.nUndec == 0 )
    {
        printf( "Miter is trivially unsatisfiable.\n" );
        return 0;
    }
    Aig_ManRandom( 1 );
    p = Raig_ManCreate( pAig );
    p->nWords = nWords;
    // iterate through objects
    for ( i = 0; i < nIters; i++ )
    {
        clk = Abc_Clock();
        RetValue = Raig_ManSimulateRound( p, fMiter, i==0, &iPat );
        if ( fVerbose )
        {
            printf( "Frame %4d out of %4d and timeout %3d sec. ", i+1, nIters, TimeLimit );
            printf("Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC);
        }
        if ( RetValue > 0 )
        {
            int iOut = Raig_ManFindPo(p->pAig, RetValue);
            assert( pAig->pSeqModel == NULL );
            pAig->pSeqModel = Raig_ManGenerateCounter( pAig, i, iOut, nWords, iPat, p->vCis2Ids );
            if ( fVerbose )
            printf( "Miter is satisfiable after simulation (output %d).\n", iOut );
            break;
        }
        if ( (Abc_Clock() - clk)/CLOCKS_PER_SEC >= TimeLimit )
        {
            printf( "No bug detected after %d frames with time limit %d seconds.\n", i+1, TimeLimit );
            break;
        }
    }
    if ( fVerbose )
    {
        printf( "Maxcut = %8d.  AigMem = %7.2f MB.  SimMem = %7.2f MB.  ", 
            p->nMemsMax, 
            1.0*(p->nObjs * 16)/(1<<20), 
            1.0*(p->nMemsMax * 4 * (nWords+1))/(1<<20) );
        ABC_PRT( "Total time", Abc_Clock() - clkTotal );
    }
    Raig_ManDelete( p );
    return RetValue > 0;
}